

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O2

bool __thiscall nuraft::raft_server::check_leadership_validity(raft_server *this)

{
  element_type *peVar1;
  size_type sVar2;
  uint uVar3;
  int32 iVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  bool bVar8;
  uint uVar9;
  string local_68;
  element_type *local_48;
  unique_lock<std::recursive_mutex> guard;
  
  std::unique_lock<std::recursive_mutex>::unique_lock(&guard,&this->lock_);
  if ((this->role_)._M_i == leader) {
    uVar3 = get_num_voting_members(this);
    iVar4 = get_leadership_expiry(this);
    sVar7 = get_not_responding_peers(this);
    uVar9 = 0;
    if (-1 < iVar4) {
      uVar9 = (uint)sVar7;
    }
    iVar4 = get_quorum_for_commit(this);
    bVar8 = true;
    if (iVar4 < (int)(uVar3 - uVar9)) goto LAB_00211025;
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1 != (element_type *)0x0) {
      iVar5 = (*peVar1->_vptr_logger[7])();
      if (1 < iVar5) {
        local_48 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        sVar2 = (this->peers_)._M_h._M_element_count;
        uVar6 = get_leadership_expiry(this);
        msg_if_given_abi_cxx11_
                  (&local_68,
                   "%d nodes (out of %d, %zu including learners) are not responding longer than %d ms, at least %d nodes (including leader) should be alive to proceed commit"
                   ,(ulong)uVar9,(ulong)uVar3,sVar2 + 1,(ulong)uVar6,iVar4 + 1);
        (*local_48->_vptr_logger[8])
                  (local_48,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"check_leadership_validity",0x449,&local_68);
        std::__cxx11::string::~string((string *)&local_68);
      }
    }
    peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((int)uVar3 <= iVar4 + 1) {
      if (peVar1 != (element_type *)0x0) {
        iVar5 = (*peVar1->_vptr_logger[7])();
        if (2 < iVar5) {
          peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_(&local_68,"we cannot yield the leadership of this small cluster");
          (*peVar1->_vptr_logger[8])
                    (peVar1,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"check_leadership_validity",0x450,&local_68);
          std::__cxx11::string::~string((string *)&local_68);
        }
      }
      goto LAB_00211025;
    }
    if (peVar1 != (element_type *)0x0) {
      iVar5 = (*peVar1->_vptr_logger[7])();
      if (1 < iVar5) {
        peVar1 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_(&local_68,"will yield the leadership of this node");
        (*peVar1->_vptr_logger[8])
                  (peVar1,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                   ,"check_leadership_validity",0x454,&local_68);
        std::__cxx11::string::~string((string *)&local_68);
      }
    }
    yield_leadership(this,true,-1);
  }
  bVar8 = false;
LAB_00211025:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&guard);
  return bVar8;
}

Assistant:

bool raft_server::check_leadership_validity() {
    recur_lock(lock_);

    if (role_ != leader)
        return false;

    // Check if quorum is not responding.
    int32 num_voting_members = get_num_voting_members();

    int leadership_expiry = get_leadership_expiry();
    int32 nr_peers = (int32)get_not_responding_peers();
    if (leadership_expiry < 0) {
        // Negative expiry: leadership will never expire.
        nr_peers = 0;
    }
    int32 min_quorum_size = get_quorum_for_commit() + 1;
    if ( (num_voting_members - nr_peers) < min_quorum_size ) {
        p_er("%d nodes (out of %d, %zu including learners) are not "
             "responding longer than %d ms, "
             "at least %d nodes (including leader) should be alive "
             "to proceed commit",
             nr_peers,
             num_voting_members,
             peers_.size() + 1,
             get_leadership_expiry(),
             min_quorum_size);

        // NOTE:
        //   For a cluster where the number of members is the same
        //   as the size of quorum, we should not expire leadership,
        //   since it will block the cluster doing any further actions.
        if (num_voting_members <= min_quorum_size) {
            p_wn("we cannot yield the leadership of this small cluster");
            return true;
        }

        p_er("will yield the leadership of this node");
        yield_leadership(true);
        return false;
    }
    return true;
}